

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

void __thiscall CEditor::DoQuad(CEditor *this,CQuad *q,int Index)

{
  CPoint *pCenter;
  undefined4 uVar1;
  undefined4 uVar2;
  int v;
  int iVar3;
  uint uVar4;
  int iVar5;
  byte bVar6;
  long lVar7;
  long in_FS_OFFSET;
  float fVar8;
  float fVar9;
  float fVar12;
  CPoint CVar10;
  CPoint CVar11;
  CPoint CVar13;
  CPoint CVar14;
  CPoint CVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 local_48;
  float local_40;
  float local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCenter = q->m_aPoints + 4;
  uVar1 = (this->m_UI).m_MouseWorldX;
  uVar2 = (this->m_UI).m_MouseWorldY;
  fVar8 = (float)q->m_aPoints[4].x * 0.0009765625;
  fVar12 = (float)q->m_aPoints[4].y * 0.0009765625;
  fVar16 = (fVar8 - (float)uVar1) / this->m_WorldZoom;
  fVar9 = (fVar12 - (float)uVar2) / this->m_WorldZoom;
  if (fVar16 * fVar16 + fVar9 * fVar9 < 50.0) {
    (this->m_UI).m_pBecommingHotItem = pCenter;
  }
  iVar3 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x162);
  bVar6 = 1;
  if ((char)iVar3 == '\0') {
    iVar3 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x166);
    bVar6 = (byte)iVar3;
  }
  if (this->m_SelectedQuad == Index) {
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
    local_40 = this->m_WorldZoom * 7.0;
    local_48 = CONCAT44(fVar12,fVar8);
    local_3c = local_40;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])(this->m_pGraphics,&local_48,1);
  }
  if ((CPoint *)(this->m_UI).m_pActiveItem == pCenter) {
    (this->m_UI).m_ActiveItemValid = true;
    iVar3 = DoQuad::s_Operation;
    if (0.5 < this->m_MouseDeltaWx * this->m_MouseDeltaWx +
              this->m_MouseDeltaWy * this->m_MouseDeltaWy) {
      if (DoQuad::s_Operation == 1) {
        iVar3 = 1;
        if ((byte)(bVar6 | this->m_GridActive ^ 1U) == 1) {
          for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
            CVar14.x = q->m_aPoints[lVar7].x + (int)(((float)uVar1 - DoQuad::s_LastWx) * 1024.0);
            CVar14.y = q->m_aPoints[lVar7].y + (int)(((float)uVar2 - DoQuad::s_LastWy) * 1024.0);
            q->m_aPoints[lVar7] = CVar14;
          }
        }
        else {
          uVar4 = GetLineDistance(this);
          iVar5 = (uVar4 >> 1) * this->m_GridFactor;
          fVar9 = (float)iVar5;
          fVar16 = (float)iVar5;
          auVar21._0_4_ =
               (float)((uint)-fVar9 & -(uint)((float)uVar1 < 0.0) |
                      ~-(uint)((float)uVar1 < 0.0) & (uint)fVar9) + (float)uVar1;
          auVar21._4_4_ =
               (float)((uint)-fVar16 & -(uint)((float)uVar2 < 0.0) |
                      ~-(uint)((float)uVar2 < 0.0) & (uint)fVar16) + (float)uVar2;
          auVar21._8_8_ = 0;
          uVar19 = (ulong)uVar4 * (ulong)(uint)this->m_GridFactor;
          iVar5 = (int)(uVar19 >> 0x20);
          auVar18._0_4_ = (float)(int)uVar19;
          auVar18._4_4_ = (float)(int)uVar19;
          auVar18._8_4_ = (float)iVar5;
          auVar18._12_4_ = (float)iVar5;
          auVar21 = divps(auVar21,auVar18);
          CVar14 = *pCenter;
          CVar11.x = (int)((float)(int)((uVar19 & 0xffffffff) * (ulong)(uint)(int)auVar21._0_4_) *
                          1024.0);
          CVar11.y = (int)((float)(int)((ulong)(uint)(int)auVar21._4_4_ * (uVar19 & 0xffffffff)) *
                          1024.0);
          *pCenter = CVar11;
          for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
            CVar15.x = q->m_aPoints[lVar7].x + (CVar11.x - CVar14.x);
            CVar15.y = q->m_aPoints[lVar7].y + (CVar11.y - CVar14.y);
            q->m_aPoints[lVar7] = CVar15;
          }
        }
      }
      else if (DoQuad::s_Operation == 2) {
        if (bVar6 == 0 && this->m_GridActive == true) {
          uVar4 = GetLineDistance(this);
          iVar3 = this->m_GridFactor;
          fVar9 = (float)(int)(iVar3 * (uVar4 >> 1));
          fVar16 = (float)(int)((uVar4 >> 1) * iVar3);
          auVar20._0_4_ =
               (float)((uint)-fVar9 & -(uint)((float)uVar1 < 0.0) |
                      ~-(uint)((float)uVar1 < 0.0) & (uint)fVar9) + (float)uVar1;
          auVar20._4_4_ =
               (float)((uint)-fVar16 & -(uint)((float)uVar2 < 0.0) |
                      ~-(uint)((float)uVar2 < 0.0) & (uint)fVar16) + (float)uVar2;
          auVar20._8_8_ = 0;
          auVar17._0_4_ = (float)(int)(iVar3 * uVar4);
          auVar17._4_4_ = (float)(int)(iVar3 * uVar4);
          auVar17._8_8_ = 0;
          auVar21 = divps(auVar20,auVar17);
          CVar10.x = (int)((float)(int)(iVar3 * uVar4 * (int)auVar21._0_4_) * 1024.0);
          CVar10.y = (int)((float)(int)((int)auVar21._4_4_ * iVar3 * uVar4) * 1024.0);
          *pCenter = CVar10;
        }
        else {
          CVar13.x = (*pCenter).x + (int)(((float)uVar1 - DoQuad::s_LastWx) * 1024.0);
          CVar13.y = (*pCenter).y + (int)(((float)uVar2 - DoQuad::s_LastWy) * 1024.0);
          *pCenter = CVar13;
        }
        iVar3 = 2;
      }
      else if (DoQuad::s_Operation == 3) {
        for (lVar7 = 0; iVar3 = DoQuad::s_Operation, lVar7 != 0x20; lVar7 = lVar7 + 8) {
          *(undefined8 *)((long)&q->m_aPoints[0].x + lVar7) =
               *(undefined8 *)((long)&DoQuad::s_RotatePoints[0].x + lVar7);
          Rotate(pCenter,(CPoint *)((long)&q->m_aPoints[0].x + lVar7),DoQuad::s_RotateAngle);
        }
      }
    }
    DoQuad::s_RotateAngle = this->m_MouseDeltaX * 0.002 + DoQuad::s_RotateAngle;
    uVar4 = (this->m_UI).m_MouseButtons;
    if (iVar3 == 4) {
      DoQuad::s_LastWx = (float)uVar1;
      DoQuad::s_LastWy = (float)uVar2;
      if ((uVar4 & 2) == 0) {
        CUI::DoPopupMenu(&this->m_UI,(int)(this->m_UI).m_MouseX,(int)(this->m_UI).m_MouseY,0x78,0xb4
                         ,this,PopupQuad,0xf);
LAB_0018832c:
        this->m_LockMouse = false;
        DoQuad::s_Operation = 0;
        (this->m_UI).m_ActiveItemValid = true;
        (this->m_UI).m_pActiveItem = (void *)0x0;
      }
    }
    else {
      DoQuad::s_LastWx = (float)uVar1;
      DoQuad::s_LastWy = (float)uVar2;
      if ((uVar4 & 1) == 0) goto LAB_0018832c;
    }
    iVar3 = this->m_pConfig->m_EdColorQuadPivotActive;
  }
  else {
    if ((CPoint *)(this->m_UI).m_pHotItem == pCenter) {
      ms_pUiGotContext = pCenter;
      HexToRgba(this->m_pConfig->m_EdColorQuadPivotHover);
      this->m_pTooltip =
           "Left mouse button to move. Hold shift to move pivot. Hold ctrl to rotate. Hold alt to ignore grid."
      ;
      uVar4 = (this->m_UI).m_MouseButtons;
      if ((uVar4 & 1) != 0) {
        iVar3 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x161);
        if (((char)iVar3 == '\0') &&
           (iVar3 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x165),
           (char)iVar3 == '\0')) {
          iVar3 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x160);
          if (((char)iVar3 == '\0') &&
             (iVar3 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])
                                (this->m_pInput,0x164), (char)iVar3 == '\0')) {
            DoQuad::s_Operation = 1;
          }
          else {
            this->m_LockMouse = true;
            DoQuad::s_Operation = 3;
            DoQuad::s_RotateAngle = 0.0;
            DoQuad::s_RotatePoints[0] = q->m_aPoints[0];
            DoQuad::s_RotatePoints[1] = q->m_aPoints[1];
            DoQuad::s_RotatePoints[2] = q->m_aPoints[2];
            DoQuad::s_RotatePoints[3] = q->m_aPoints[3];
          }
        }
        else {
          DoQuad::s_Operation = 2;
        }
        (this->m_UI).m_ActiveItemValid = true;
        (this->m_UI).m_pActiveItem = pCenter;
        (this->m_UI).m_pLastActiveItem = pCenter;
        if (this->m_SelectedQuad != Index) {
          this->m_SelectedPoints = 0;
        }
        this->m_SelectedQuad = Index;
        uVar4 = (this->m_UI).m_MouseButtons;
        DoQuad::s_LastWx = (float)uVar1;
        DoQuad::s_LastWy = (float)uVar2;
      }
      if ((uVar4 & 2) != 0) {
        if (this->m_SelectedQuad != Index) {
          this->m_SelectedPoints = 0;
        }
        this->m_SelectedQuad = Index;
        DoQuad::s_Operation = 4;
        (this->m_UI).m_ActiveItemValid = true;
        (this->m_UI).m_pActiveItem = pCenter;
        (this->m_UI).m_pLastActiveItem = pCenter;
      }
      goto LAB_00188358;
    }
    iVar3 = this->m_pConfig->m_EdColorQuadPivot;
  }
  HexToRgba(iVar3);
LAB_00188358:
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
  local_40 = this->m_WorldZoom * 5.0;
  local_48 = CONCAT44(fVar12,fVar8);
  local_3c = local_40;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])(this->m_pGraphics,&local_48,1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditor::DoQuad(CQuad *q, int Index)
{
	enum
	{
		OP_NONE=0,
		OP_MOVE_ALL,
		OP_MOVE_PIVOT,
		OP_ROTATE,
		OP_CONTEXT_MENU,
	};

	// some basic values
	void *pID = &q->m_aPoints[4]; // use pivot addr as id
	static CPoint s_RotatePoints[4];
	static float s_LastWx;
	static float s_LastWy;
	static int s_Operation = OP_NONE;
	static float s_RotateAngle = 0;
	float wx = UI()->MouseWorldX();
	float wy = UI()->MouseWorldY();

	// get pivot
	float CenterX = fx2f(q->m_aPoints[4].x);
	float CenterY = fx2f(q->m_aPoints[4].y);

	float dx = (CenterX - wx)/m_WorldZoom;
	float dy = (CenterY - wy)/m_WorldZoom;
	if(dx*dx+dy*dy < 50)
		UI()->SetHotItem(pID);

	bool IgnoreGrid;
	if(Input()->KeyIsPressed(KEY_LALT) || Input()->KeyIsPressed(KEY_RALT))
		IgnoreGrid = true;
	else
		IgnoreGrid = false;

	// draw selection background
	if(m_SelectedQuad == Index)
	{
		Graphics()->SetColor(0,0,0,1);
		IGraphics::CQuadItem QuadItem(CenterX, CenterY, 7.0f*m_WorldZoom, 7.0f*m_WorldZoom);
		Graphics()->QuadsDraw(&QuadItem, 1);
	}

	vec4 PivotColor;

	if(UI()->CheckActiveItem(pID))
	{
		if(m_MouseDeltaWx*m_MouseDeltaWx+m_MouseDeltaWy*m_MouseDeltaWy > 0.5f)
		{
			// check if we only should move pivot
			if(s_Operation == OP_MOVE_PIVOT)
			{
				if(m_GridActive && !IgnoreGrid)
				{
					int LineDistance = GetLineDistance();

					float x = 0.0f;
					float y = 0.0f;
					if(wx >= 0)
						x = (int)((wx+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					else
						x = (int)((wx-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					if(wy >= 0)
						y = (int)((wy+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					else
						y = (int)((wy-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);

					q->m_aPoints[4].x = f2fx(x);
					q->m_aPoints[4].y = f2fx(y);
				}
				else
				{
					q->m_aPoints[4].x += f2fx(wx-s_LastWx);
					q->m_aPoints[4].y += f2fx(wy-s_LastWy);
				}
			}
			else if(s_Operation == OP_MOVE_ALL)
			{
				// move all points including pivot
				if(m_GridActive && !IgnoreGrid)
				{
					int LineDistance = GetLineDistance();

					float x = 0.0f;
					float y = 0.0f;
					if(wx >= 0)
						x = (int)((wx+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					else
						x = (int)((wx-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					if(wy >= 0)
						y = (int)((wy+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					else
						y = (int)((wy-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);

					int OldX = q->m_aPoints[4].x;
					int OldY = q->m_aPoints[4].y;
					q->m_aPoints[4].x = f2fx(x);
					q->m_aPoints[4].y = f2fx(y);
					int DiffX = q->m_aPoints[4].x - OldX;
					int DiffY = q->m_aPoints[4].y - OldY;

					for(int v = 0; v < 4; v++)
					{
						q->m_aPoints[v].x += DiffX;
						q->m_aPoints[v].y += DiffY;
					}
				}
				else
				{
					for(int v = 0; v < 5; v++)
					{
							q->m_aPoints[v].x += f2fx(wx-s_LastWx);
							q->m_aPoints[v].y += f2fx(wy-s_LastWy);
					}
				}
			}
			else if(s_Operation == OP_ROTATE)
			{
				for(int v = 0; v < 4; v++)
				{
					q->m_aPoints[v] = s_RotatePoints[v];
					Rotate(&q->m_aPoints[4], &q->m_aPoints[v], s_RotateAngle);
				}
			}
		}

		s_RotateAngle += (m_MouseDeltaX) * 0.002f;
		s_LastWx = wx;
		s_LastWy = wy;

		if(s_Operation == OP_CONTEXT_MENU)
		{
			if(!UI()->MouseButton(1))
			{
				UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 120, 180, this, PopupQuad);
				m_LockMouse = false;
				s_Operation = OP_NONE;
				UI()->SetActiveItem(0);
			}
		}
		else
		{
			if(!UI()->MouseButton(0))
			{
				m_LockMouse = false;
				s_Operation = OP_NONE;
				UI()->SetActiveItem(0);
			}
		}

		PivotColor = HexToRgba(Config()->m_EdColorQuadPivotActive);
	}
	else if(UI()->HotItem() == pID)
	{
		ms_pUiGotContext = pID;

		PivotColor = HexToRgba(Config()->m_EdColorQuadPivotHover);
		m_pTooltip = "Left mouse button to move. Hold shift to move pivot. Hold ctrl to rotate. Hold alt to ignore grid.";

		if(UI()->MouseButton(0))
		{
			if(Input()->KeyIsPressed(KEY_LSHIFT) || Input()->KeyIsPressed(KEY_RSHIFT))
				s_Operation = OP_MOVE_PIVOT;
			else if(Input()->KeyIsPressed(KEY_LCTRL) || Input()->KeyIsPressed(KEY_RCTRL))
			{
				m_LockMouse = true;
				s_Operation = OP_ROTATE;
				s_RotateAngle = 0;
				s_RotatePoints[0] = q->m_aPoints[0];
				s_RotatePoints[1] = q->m_aPoints[1];
				s_RotatePoints[2] = q->m_aPoints[2];
				s_RotatePoints[3] = q->m_aPoints[3];
			}
			else
				s_Operation = OP_MOVE_ALL;

			UI()->SetActiveItem(pID);
			if(m_SelectedQuad != Index)
				m_SelectedPoints = 0;
			m_SelectedQuad = Index;
			s_LastWx = wx;
			s_LastWy = wy;
		}

		if(UI()->MouseButton(1))
		{
			if(m_SelectedQuad != Index)
				m_SelectedPoints = 0;
			m_SelectedQuad = Index;
			s_Operation = OP_CONTEXT_MENU;
			UI()->SetActiveItem(pID);
		}
	}
	else
		PivotColor = HexToRgba(Config()->m_EdColorQuadPivot);

	Graphics()->SetColor(PivotColor.r, PivotColor.g, PivotColor.b, PivotColor.a);
	IGraphics::CQuadItem QuadItem(CenterX, CenterY, 5.0f*m_WorldZoom, 5.0f*m_WorldZoom);
	Graphics()->QuadsDraw(&QuadItem, 1);
}